

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

cram_container * cram_read_container(cram_fd *fd)

{
  int iVar1;
  uint32_t uVar2;
  int32_t *piVar3;
  int *piVar4;
  byte *pbVar5;
  undefined4 uVar6;
  bool bVar7;
  int local_320;
  int local_31c;
  int local_318;
  int local_314;
  int local_310;
  int local_30c;
  int local_308;
  int local_304;
  int local_300;
  int local_2fc;
  int local_2f8;
  int local_2f4;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  int local_2c0;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  byte *local_2a0;
  uchar *cp;
  uchar *dat;
  uint32_t i_1;
  uint32_t crc;
  int32_t i32;
  size_t rd;
  int s;
  int i;
  cram_container *c;
  cram_container c2;
  cram_fd *fd_local;
  
  _crc = (cram_container *)0x0;
  fd->err = 0;
  fd->eof = 0;
  c2._584_8_ = fd;
  memset(&c,0,0x250);
  if (*(int *)(c2._584_8_ + 0xc) >> 8 == 1) {
    rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,(int32_t *)&c);
    if ((int)rd == -1) {
      uVar6 = 2;
      if (*(int *)(c2._584_8_ + 0x8858) != 0) {
        uVar6 = 1;
      }
      *(undefined4 *)(c2._584_8_ + 0x8848) = uVar6;
      return (cram_container *)0x0;
    }
    _crc = (cram_container *)((long)(int)rd + (long)_crc);
  }
  else {
    rd._0_4_ = int32_decode((cram_fd *)c2._584_8_,(int32_t *)&c);
    if ((int)rd == -1) {
      if ((*(int *)(c2._584_8_ + 0xc) >> 8 == 2) && ((*(uint *)(c2._584_8_ + 0xc) & 0xff) == 0)) {
        *(undefined4 *)(c2._584_8_ + 0x8848) = 1;
      }
      else {
        uVar6 = 2;
        if (*(int *)(c2._584_8_ + 0x8858) != 0) {
          uVar6 = 1;
        }
        *(undefined4 *)(c2._584_8_ + 0x8848) = uVar6;
      }
      return (cram_container *)0x0;
    }
    _crc = (cram_container *)((long)(int)rd + (long)_crc);
  }
  rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,(int32_t *)((long)&c + 4));
  if ((int)rd == -1) {
    fd_local = (cram_fd *)0x0;
  }
  else {
    _crc = (cram_container *)((long)(int)rd + (long)_crc);
    rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,&c2.length);
    if ((int)rd == -1) {
      fd_local = (cram_fd *)0x0;
    }
    else {
      _crc = (cram_container *)((long)(int)rd + (long)_crc);
      rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,&c2.ref_seq_id);
      if ((int)rd == -1) {
        fd_local = (cram_fd *)0x0;
      }
      else {
        _crc = (cram_container *)((long)(int)rd + (long)_crc);
        rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,(int32_t *)&c2.num_bases);
        if ((int)rd == -1) {
          fd_local = (cram_fd *)0x0;
        }
        else {
          _crc = (cram_container *)((long)(int)rd + (long)_crc);
          if (*(int *)(c2._584_8_ + 0xc) >> 8 == 1) {
            c2.ref_seq_start = 0;
            c2.ref_seq_span = 0;
            c2.record_counter = 0;
          }
          else {
            if (*(int *)(c2._584_8_ + 0xc) >> 8 < 3) {
              rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,(int32_t *)&i_1);
              if ((int)rd == -1) {
                return (cram_container *)0x0;
              }
              _crc = (cram_container *)((long)(int)rd + (long)_crc);
              c2._8_8_ = SEXT48((int)i_1);
            }
            else {
              rd._0_4_ = ltf8_decode((cram_fd *)c2._584_8_,(int64_t *)&c2.ref_seq_start);
              if ((int)rd == -1) {
                return (cram_container *)0x0;
              }
              _crc = (cram_container *)((long)(int)rd + (long)_crc);
            }
            rd._0_4_ = ltf8_decode((cram_fd *)c2._584_8_,&c2.record_counter);
            if ((int)rd == -1) {
              return (cram_container *)0x0;
            }
            _crc = (cram_container *)((long)(int)rd + (long)_crc);
          }
          rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,(int32_t *)((long)&c2.num_bases + 4));
          if ((int)rd == -1) {
            fd_local = (cram_fd *)0x0;
          }
          else {
            _crc = (cram_container *)((long)(int)rd + (long)_crc);
            rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,&c2.num_records);
            if ((int)rd == -1) {
              fd_local = (cram_fd *)0x0;
            }
            else {
              _crc = (cram_container *)((long)(int)rd + (long)_crc);
              _s = (cram_fd *)calloc(1,0x250);
              if (_s == (cram_fd *)0x0) {
                fd_local = (cram_fd *)0x0;
              }
              else {
                memcpy(_s,&c,0x250);
                piVar3 = (int32_t *)malloc((long)(int)_s->record_counter << 2);
                *(int32_t **)&_s->err = piVar3;
                if ((piVar3 == (int32_t *)0x0) && ((int)_s->record_counter != 0)) {
                  piVar4 = __errno_location();
                  *(int *)(c2._584_8_ + 0x30) = *piVar4;
                  cram_free_container((cram_container *)_s);
                  fd_local = (cram_fd *)0x0;
                }
                else {
                  for (rd._4_4_ = 0; rd._4_4_ < (int)_s->record_counter; rd._4_4_ = rd._4_4_ + 1) {
                    rd._0_4_ = itf8_decode((cram_fd *)c2._584_8_,*(int32_t **)&_s->err + rd._4_4_);
                    if ((int)rd == -1) {
                      cram_free_container((cram_container *)_s);
                      return (cram_container *)0x0;
                    }
                    _crc = (cram_container *)((long)&_crc->length + (long)(int)rd);
                  }
                  if (2 < *(int *)(c2._584_8_ + 0xc) >> 8) {
                    piVar3 = (int32_t *)malloc((long)((int)_s->record_counter * 5 + 0x32));
                    if (piVar3 == (int32_t *)0x0) {
                      cram_free_container((cram_container *)_s);
                      return (cram_container *)0x0;
                    }
                    iVar1 = int32_decode((cram_fd *)c2._584_8_,(int32_t *)(_s->bam_flag_swap + 5));
                    if (iVar1 == -1) {
                      return (cram_container *)0x0;
                    }
                    _crc = (cram_container *)&_crc->ref_seq_id;
                    *piVar3 = *(int32_t *)&_s->fp;
                    pbVar5 = (byte *)(piVar3 + 1);
                    if (((ulong)_s->fp & 0xffffff8000000000) == 0) {
                      *pbVar5 = (byte)*(int32_t *)((long)&_s->fp + 4);
                      local_2a4 = 1;
                    }
                    else {
                      if (((ulong)_s->fp & 0xffffc00000000000) == 0) {
                        *pbVar5 = (byte)((uint)*(int32_t *)((long)&_s->fp + 4) >> 8) | 0x80;
                        *(char *)((long)piVar3 + 5) = (char)*(int32_t *)((long)&_s->fp + 4);
                        local_2a8 = 2;
                      }
                      else {
                        if (((ulong)_s->fp & 0xffe0000000000000) == 0) {
                          *pbVar5 = (byte)((uint)*(int32_t *)((long)&_s->fp + 4) >> 0x10) | 0xc0;
                          *(char *)((long)piVar3 + 5) =
                               (char)((uint)*(int32_t *)((long)&_s->fp + 4) >> 8);
                          *(char *)((long)piVar3 + 6) = (char)*(int32_t *)((long)&_s->fp + 4);
                          local_2ac = 3;
                        }
                        else {
                          if (((ulong)_s->fp & 0xf000000000000000) == 0) {
                            *pbVar5 = (byte)((uint)*(int32_t *)((long)&_s->fp + 4) >> 0x18) | 0xe0;
                            *(char *)((long)piVar3 + 5) =
                                 (char)((uint)*(int32_t *)((long)&_s->fp + 4) >> 0x10);
                            *(char *)((long)piVar3 + 6) =
                                 (char)((uint)*(int32_t *)((long)&_s->fp + 4) >> 8);
                            *(char *)((long)piVar3 + 7) = (char)*(int32_t *)((long)&_s->fp + 4);
                            local_2b0 = 4;
                          }
                          else {
                            *pbVar5 = (byte)(*(int32_t *)((long)&_s->fp + 4) >> 0x1c) | 0xf0;
                            *(char *)((long)piVar3 + 5) =
                                 (char)(*(int32_t *)((long)&_s->fp + 4) >> 0x14);
                            *(char *)((long)piVar3 + 6) =
                                 (char)(*(int32_t *)((long)&_s->fp + 4) >> 0xc);
                            *(char *)((long)piVar3 + 7) =
                                 (char)(*(int32_t *)((long)&_s->fp + 4) >> 4);
                            *(byte *)(piVar3 + 2) = (byte)*(int32_t *)((long)&_s->fp + 4) & 0xf;
                            local_2b0 = 5;
                          }
                          local_2ac = local_2b0;
                        }
                        local_2a8 = local_2ac;
                      }
                      local_2a4 = local_2a8;
                    }
                    pbVar5 = pbVar5 + local_2a4;
                    if ((_s->mode & 0xffffff80U) == 0) {
                      *pbVar5 = (byte)_s->mode;
                      local_2b4 = 1;
                    }
                    else {
                      if ((_s->mode & 0xffffc000U) == 0) {
                        *pbVar5 = (byte)((uint)_s->mode >> 8) | 0x80;
                        pbVar5[1] = (byte)_s->mode;
                        local_2b8 = 2;
                      }
                      else {
                        if ((_s->mode & 0xffe00000U) == 0) {
                          *pbVar5 = (byte)((uint)_s->mode >> 0x10) | 0xc0;
                          pbVar5[1] = (byte)((uint)_s->mode >> 8);
                          pbVar5[2] = (byte)_s->mode;
                          local_2bc = 3;
                        }
                        else {
                          if ((_s->mode & 0xf0000000U) == 0) {
                            *pbVar5 = (byte)((uint)_s->mode >> 0x18) | 0xe0;
                            pbVar5[1] = (byte)((uint)_s->mode >> 0x10);
                            pbVar5[2] = (byte)((uint)_s->mode >> 8);
                            pbVar5[3] = (byte)_s->mode;
                            local_2c0 = 4;
                          }
                          else {
                            *pbVar5 = (byte)(_s->mode >> 0x1c) | 0xf0;
                            pbVar5[1] = (byte)(_s->mode >> 0x14);
                            pbVar5[2] = (byte)(_s->mode >> 0xc);
                            pbVar5[3] = (byte)(_s->mode >> 4);
                            pbVar5[4] = (byte)_s->mode & 0xf;
                            local_2c0 = 5;
                          }
                          local_2bc = local_2c0;
                        }
                        local_2b8 = local_2bc;
                      }
                      local_2b4 = local_2b8;
                    }
                    pbVar5 = pbVar5 + local_2b4;
                    if ((_s->version & 0xffffff80U) == 0) {
                      *pbVar5 = (byte)_s->version;
                      local_2c4 = 1;
                    }
                    else {
                      if ((_s->version & 0xffffc000U) == 0) {
                        *pbVar5 = (byte)((uint)_s->version >> 8) | 0x80;
                        pbVar5[1] = (byte)_s->version;
                        local_2c8 = 2;
                      }
                      else {
                        if ((_s->version & 0xffe00000U) == 0) {
                          *pbVar5 = (byte)((uint)_s->version >> 0x10) | 0xc0;
                          pbVar5[1] = (byte)((uint)_s->version >> 8);
                          pbVar5[2] = (byte)_s->version;
                          local_2cc = 3;
                        }
                        else {
                          if ((_s->version & 0xf0000000U) == 0) {
                            *pbVar5 = (byte)((uint)_s->version >> 0x18) | 0xe0;
                            pbVar5[1] = (byte)((uint)_s->version >> 0x10);
                            pbVar5[2] = (byte)((uint)_s->version >> 8);
                            pbVar5[3] = (byte)_s->version;
                            local_2d0 = 4;
                          }
                          else {
                            *pbVar5 = (byte)(_s->version >> 0x1c) | 0xf0;
                            pbVar5[1] = (byte)(_s->version >> 0x14);
                            pbVar5[2] = (byte)(_s->version >> 0xc);
                            pbVar5[3] = (byte)(_s->version >> 4);
                            pbVar5[4] = (byte)_s->version & 0xf;
                            local_2d0 = 5;
                          }
                          local_2cc = local_2d0;
                        }
                        local_2c8 = local_2cc;
                      }
                      local_2c4 = local_2c8;
                    }
                    pbVar5 = pbVar5 + local_2c4;
                    if (((ulong)_s->prefix & 0xffffff80) == 0) {
                      *pbVar5 = (byte)*(int32_t *)&_s->prefix;
                      local_2d4 = 1;
                    }
                    else {
                      if (((ulong)_s->prefix & 0xffffc000) == 0) {
                        *pbVar5 = (byte)((uint)*(int32_t *)&_s->prefix >> 8) | 0x80;
                        pbVar5[1] = (byte)*(int32_t *)&_s->prefix;
                        local_2d8 = 2;
                      }
                      else {
                        if (((ulong)_s->prefix & 0xffe00000) == 0) {
                          *pbVar5 = (byte)((uint)*(int32_t *)&_s->prefix >> 0x10) | 0xc0;
                          pbVar5[1] = (byte)((uint)*(int32_t *)&_s->prefix >> 8);
                          pbVar5[2] = (byte)*(int32_t *)&_s->prefix;
                          local_2dc = 3;
                        }
                        else {
                          if (((ulong)_s->prefix & 0xf0000000) == 0) {
                            *pbVar5 = (byte)((uint)*(int32_t *)&_s->prefix >> 0x18) | 0xe0;
                            pbVar5[1] = (byte)((uint)*(int32_t *)&_s->prefix >> 0x10);
                            pbVar5[2] = (byte)((uint)*(int32_t *)&_s->prefix >> 8);
                            pbVar5[3] = (byte)*(int32_t *)&_s->prefix;
                            local_2e0 = 4;
                          }
                          else {
                            *pbVar5 = (byte)(*(int32_t *)&_s->prefix >> 0x1c) | 0xf0;
                            pbVar5[1] = (byte)(*(int *)&_s->prefix >> 0x14);
                            pbVar5[2] = (byte)(*(int *)&_s->prefix >> 0xc);
                            pbVar5[3] = (byte)(*(int *)&_s->prefix >> 4);
                            pbVar5[4] = (byte)*(int32_t *)&_s->prefix & 0xf;
                            local_2e0 = 5;
                          }
                          local_2dc = local_2e0;
                        }
                        local_2d8 = local_2dc;
                      }
                      local_2d4 = local_2d8;
                    }
                    iVar1 = ltf8_put((char *)(pbVar5 + local_2d4),(int64_t)_s->file_def);
                    local_2a0 = pbVar5 + local_2d4 + iVar1;
                    if (((ulong)_s->header & 0xffffffffffffff80) == 0) {
                      *local_2a0 = (byte)_s->header;
                      local_2e4 = 1;
                    }
                    else {
                      if (((ulong)_s->header & 0xffffffffffffc000) == 0) {
                        *local_2a0 = (byte)((ulong)_s->header >> 8) | 0x80;
                        local_2a0[1] = (byte)_s->header;
                        local_2e8 = 2;
                      }
                      else {
                        if (((ulong)_s->header & 0xffffffffffe00000) == 0) {
                          *local_2a0 = (byte)((ulong)_s->header >> 0x10) | 0xc0;
                          local_2a0[1] = (byte)((ulong)_s->header >> 8);
                          local_2a0[2] = (byte)_s->header;
                          local_2ec = 3;
                        }
                        else {
                          if (((ulong)_s->header & 0xfffffffff0000000) == 0) {
                            *local_2a0 = (byte)((ulong)_s->header >> 0x18) | 0xe0;
                            local_2a0[1] = (byte)((ulong)_s->header >> 0x10);
                            local_2a0[2] = (byte)((ulong)_s->header >> 8);
                            local_2a0[3] = (byte)_s->header;
                            local_2f0 = 4;
                          }
                          else {
                            *local_2a0 = (byte)((long)_s->header >> 0x1c) | 0xf0;
                            local_2a0[1] = (byte)((long)_s->header >> 0x14);
                            local_2a0[2] = (byte)((long)_s->header >> 0xc);
                            local_2a0[3] = (byte)((long)_s->header >> 4);
                            local_2a0[4] = (byte)_s->header & 0xf;
                            local_2f0 = 5;
                          }
                          local_2ec = local_2f0;
                        }
                        local_2e8 = local_2ec;
                      }
                      local_2e4 = local_2e8;
                    }
                    local_2a0 = local_2a0 + local_2e4;
                    if (((ulong)_s->prefix & 0xffffff8000000000) == 0) {
                      *local_2a0 = (byte)*(int32_t *)((long)&_s->prefix + 4);
                      local_2f4 = 1;
                    }
                    else {
                      if (((ulong)_s->prefix & 0xffffc00000000000) == 0) {
                        *local_2a0 = (byte)((uint)*(int32_t *)((long)&_s->prefix + 4) >> 8) | 0x80;
                        local_2a0[1] = (byte)*(int32_t *)((long)&_s->prefix + 4);
                        local_2f8 = 2;
                      }
                      else {
                        if (((ulong)_s->prefix & 0xffe0000000000000) == 0) {
                          *local_2a0 = (byte)((uint)*(int32_t *)((long)&_s->prefix + 4) >> 0x10) |
                                       0xc0;
                          local_2a0[1] = (byte)((uint)*(int32_t *)((long)&_s->prefix + 4) >> 8);
                          local_2a0[2] = (byte)*(int32_t *)((long)&_s->prefix + 4);
                          local_2fc = 3;
                        }
                        else {
                          if (((ulong)_s->prefix & 0xf000000000000000) == 0) {
                            *local_2a0 = (byte)((uint)*(int32_t *)((long)&_s->prefix + 4) >> 0x18) |
                                         0xe0;
                            local_2a0[1] = (byte)((uint)*(int32_t *)((long)&_s->prefix + 4) >> 0x10)
                            ;
                            local_2a0[2] = (byte)((uint)*(int32_t *)((long)&_s->prefix + 4) >> 8);
                            local_2a0[3] = (byte)*(int32_t *)((long)&_s->prefix + 4);
                            local_300 = 4;
                          }
                          else {
                            *local_2a0 = (byte)(*(int32_t *)((long)&_s->prefix + 4) >> 0x1c) | 0xf0;
                            local_2a0[1] = (byte)(*(int32_t *)((long)&_s->prefix + 4) >> 0x14);
                            local_2a0[2] = (byte)(*(int32_t *)((long)&_s->prefix + 4) >> 0xc);
                            local_2a0[3] = (byte)(*(int32_t *)((long)&_s->prefix + 4) >> 4);
                            local_2a0[4] = (byte)*(int32_t *)((long)&_s->prefix + 4) & 0xf;
                            local_300 = 5;
                          }
                          local_2fc = local_300;
                        }
                        local_2f8 = local_2fc;
                      }
                      local_2f4 = local_2f8;
                    }
                    local_2a0 = local_2a0 + local_2f4;
                    if ((_s->record_counter & 0xffffff80) == 0) {
                      *local_2a0 = (byte)(int32_t)_s->record_counter;
                      local_304 = 1;
                    }
                    else {
                      if ((_s->record_counter & 0xffffc000) == 0) {
                        *local_2a0 = (byte)((uint)(int32_t)_s->record_counter >> 8) | 0x80;
                        local_2a0[1] = (byte)(int32_t)_s->record_counter;
                        local_308 = 2;
                      }
                      else {
                        if ((_s->record_counter & 0xffe00000) == 0) {
                          *local_2a0 = (byte)((uint)(int32_t)_s->record_counter >> 0x10) | 0xc0;
                          local_2a0[1] = (byte)((uint)(int32_t)_s->record_counter >> 8);
                          local_2a0[2] = (byte)(int32_t)_s->record_counter;
                          local_30c = 3;
                        }
                        else {
                          if ((_s->record_counter & 0xf0000000) == 0) {
                            *local_2a0 = (byte)((uint)(int32_t)_s->record_counter >> 0x18) | 0xe0;
                            local_2a0[1] = (byte)((uint)(int32_t)_s->record_counter >> 0x10);
                            local_2a0[2] = (byte)((uint)(int32_t)_s->record_counter >> 8);
                            local_2a0[3] = (byte)(int32_t)_s->record_counter;
                            local_310 = 4;
                          }
                          else {
                            *local_2a0 = (byte)((int32_t)_s->record_counter >> 0x1c) | 0xf0;
                            local_2a0[1] = (byte)((int)_s->record_counter >> 0x14);
                            local_2a0[2] = (byte)((int)_s->record_counter >> 0xc);
                            local_2a0[3] = (byte)((int)_s->record_counter >> 4);
                            local_2a0[4] = (byte)(int32_t)_s->record_counter & 0xf;
                            local_310 = 5;
                          }
                          local_30c = local_310;
                        }
                        local_308 = local_30c;
                      }
                      local_304 = local_308;
                    }
                    local_2a0 = local_2a0 + local_304;
                    for (dat._4_4_ = 0; dat._4_4_ < (uint)_s->record_counter;
                        dat._4_4_ = dat._4_4_ + 1) {
                      if (((*(int32_t **)&_s->err)[dat._4_4_] & 0xffffff80U) == 0) {
                        *local_2a0 = (byte)(*(int32_t **)&_s->err)[dat._4_4_];
                        local_314 = 1;
                      }
                      else {
                        if (((*(int32_t **)&_s->err)[dat._4_4_] & 0xffffc000U) == 0) {
                          *local_2a0 = (byte)((uint)(*(int32_t **)&_s->err)[dat._4_4_] >> 8) | 0x80;
                          local_2a0[1] = (byte)(*(int32_t **)&_s->err)[dat._4_4_];
                          local_318 = 2;
                        }
                        else {
                          if (((*(int32_t **)&_s->err)[dat._4_4_] & 0xffe00000U) == 0) {
                            *local_2a0 = (byte)((uint)(*(int32_t **)&_s->err)[dat._4_4_] >> 0x10) |
                                         0xc0;
                            local_2a0[1] = (byte)((uint)(*(int32_t **)&_s->err)[dat._4_4_] >> 8);
                            local_2a0[2] = (byte)(*(int32_t **)&_s->err)[dat._4_4_];
                            local_31c = 3;
                          }
                          else {
                            if (((*(int32_t **)&_s->err)[dat._4_4_] & 0xf0000000U) == 0) {
                              *local_2a0 = (byte)((uint)(*(int32_t **)&_s->err)[dat._4_4_] >> 0x18)
                                           | 0xe0;
                              local_2a0[1] = (byte)((uint)(*(int32_t **)&_s->err)[dat._4_4_] >> 0x10
                                                   );
                              local_2a0[2] = (byte)((uint)(*(int32_t **)&_s->err)[dat._4_4_] >> 8);
                              local_2a0[3] = (byte)(*(int32_t **)&_s->err)[dat._4_4_];
                              local_320 = 4;
                            }
                            else {
                              *local_2a0 = (byte)((*(int32_t **)&_s->err)[dat._4_4_] >> 0x1c) | 0xf0
                              ;
                              local_2a0[1] = (byte)((*(int32_t **)&_s->err)[dat._4_4_] >> 0x14);
                              local_2a0[2] = (byte)((*(int32_t **)&_s->err)[dat._4_4_] >> 0xc);
                              local_2a0[3] = (byte)((*(int32_t **)&_s->err)[dat._4_4_] >> 4);
                              local_2a0[4] = (byte)(*(int32_t **)&_s->err)[dat._4_4_] & 0xf;
                              local_320 = 5;
                            }
                            local_31c = local_320;
                          }
                          local_318 = local_31c;
                        }
                        local_314 = local_318;
                      }
                      local_2a0 = local_2a0 + local_314;
                    }
                    uVar2 = crc32(0,piVar3,(long)local_2a0 - (long)piVar3 & 0xffffffff);
                    if (uVar2 != _s->bam_flag_swap[5]) {
                      fprintf(_stderr,"Container header CRC32 failure\n");
                      cram_free_container((cram_container *)_s);
                      return (cram_container *)0x0;
                    }
                  }
                  _s->ctr = _crc;
                  *(cram_slice ***)&_s->level = (cram_slice **)0x0;
                  *(int *)((long)&_s->ref + 4) = 0;
                  *(int32_t *)&_s->ref = (int32_t)_s->record_counter;
                  _s->ref_end = 0;
                  *(int *)((long)&_s->ref_free + 4) = 0;
                  *(int *)&_s->ref_free = 0;
                  if (*(int32_t *)((long)&_s->fp + 4) == -2) {
                    *(int *)((long)_s->m + 0x14) = 1;
                    *(undefined4 *)(c2._584_8_ + 0x8850) = 1;
                  }
                  bVar7 = false;
                  if ((*(int *)&_s->prefix == 0) &&
                     (bVar7 = false, *(int32_t *)((long)&_s->fp + 4) == -1)) {
                    bVar7 = _s->mode == 0x454f46;
                  }
                  *(uint *)(c2._584_8_ + 0x8858) = (uint)bVar7;
                  fd_local = _s;
                }
              }
            }
          }
        }
      }
    }
  }
  return (cram_container *)fd_local;
}

Assistant:

cram_container *cram_read_container(cram_fd *fd) {
    cram_container c2, *c;
    int i, s;
    size_t rd = 0;
    
    fd->err = 0;
    fd->eof = 0;

    memset(&c2, 0, sizeof(c2));
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if ((s = itf8_decode(fd, &c2.length)) == -1) {
	    fd->eof = fd->empty_container ? 1 : 2;
	    return NULL;
	} else {
	    rd+=s;
	}
    } else {
	if ((s = int32_decode(fd, &c2.length)) == -1) {
	    if (CRAM_MAJOR_VERS(fd->version) == 2 &&
		CRAM_MINOR_VERS(fd->version) == 0)
		fd->eof = 1; // EOF blocks arrived in v2.1
	    else
		fd->eof = fd->empty_container ? 1 : 2;
	    return NULL;
	} else {
	    rd+=s;
	}
    }
    if ((s = itf8_decode(fd, &c2.ref_seq_id))   == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.ref_seq_start))== -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.ref_seq_span)) == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.num_records))  == -1) return NULL; else rd+=s;

    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	c2.record_counter = 0;
	c2.num_bases = 0;
    } else {
	if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	    if ((s = ltf8_decode(fd, &c2.record_counter)) == -1)
		return NULL;
	    else
		rd += s;
	} else {
	    int32_t i32;
	    if ((s = itf8_decode(fd, &i32)) == -1)
		return NULL;
	    else
		rd += s;
	    c2.record_counter = i32;
	}

	if ((s = ltf8_decode(fd, &c2.num_bases))== -1)
	    return NULL;
	else
	    rd += s;
    }
    if ((s = itf8_decode(fd, &c2.num_blocks))   == -1) return NULL; else rd+=s;
    if ((s = itf8_decode(fd, &c2.num_landmarks))== -1) return NULL; else rd+=s;

    if (!(c = calloc(1, sizeof(*c))))
	return NULL;

    *c = c2;

    if (!(c->landmark = malloc(c->num_landmarks * sizeof(int32_t))) &&
	c->num_landmarks) {
	fd->err = errno;
	cram_free_container(c);
	return NULL;
    }  
    for (i = 0; i < c->num_landmarks; i++) {
	if ((s = itf8_decode(fd, &c->landmark[i])) == -1) {
	    cram_free_container(c);
	    return NULL;
	} else {
	    rd += s;
	}
    }

    if (CRAM_MAJOR_VERS(fd->version) >= 3) {
	uint32_t crc, i;
	unsigned char *dat = malloc(50 + 5*(c->num_landmarks)), *cp = dat;
	if (!dat) {
	    cram_free_container(c);
	    return NULL;
	}
	if (-1 == int32_decode(fd, (int32_t *)&c->crc32))
	    return NULL;
	else
	    rd+=4;

	/* Reencode first as we can't easily access the original byte stream.
	 *
	 * FIXME: Technically this means this may not be fool proof. We could
	 * create a CRAM file using a 2 byte ITF8 value that can fit in a 
	 * 1 byte field, meaning the encoding is different to the original
	 * form and so has a different CRC.
	 *
	 * The correct implementation would be to have an alternative form
	 * of itf8_decode which also squirrels away the raw byte stream
	 * during decoding so we can then CRC that.
	 */
	*(unsigned int *)cp = le_int4(c->length); cp += 4;
	cp += itf8_put(cp, c->ref_seq_id);
	cp += itf8_put(cp, c->ref_seq_start);
	cp += itf8_put(cp, c->ref_seq_span);
	cp += itf8_put(cp, c->num_records);
	cp += ltf8_put((char *)cp, c->record_counter);
	cp += itf8_put(cp, c->num_bases);
	cp += itf8_put(cp, c->num_blocks);
	cp += itf8_put(cp, c->num_landmarks);
	for (i = 0; i < c->num_landmarks; i++) {
	    cp += itf8_put(cp, c->landmark[i]);
	}

	crc = crc32(0L, dat, cp-dat);
	if (crc != c->crc32) {
	    fprintf(stderr, "Container header CRC32 failure\n");
	    cram_free_container(c);
	    return NULL;
	}
    }

    c->offset = rd;
    c->slices = NULL;
    c->curr_slice = 0;
    c->max_slice = c->num_landmarks;
    c->slice_rec = 0;
    c->curr_rec = 0;
    c->max_rec = 0;

    if (c->ref_seq_id == -2) {
	c->multi_seq = 1;
	fd->multi_seq = 1;
    }

    fd->empty_container =
	(c->num_records == 0 &&
	 c->ref_seq_id == -1 &&
	 c->ref_seq_start == 0x454f46 /* EOF */) ? 1 : 0;

    return c;
}